

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O2

void __thiscall QRasterPlatformPixmap::resize(QRasterPlatformPixmap *this,int width,int height)

{
  QImage *this_00;
  bool bVar1;
  Format format;
  int iVar2;
  QRgb QVar3;
  qint64 qVar4;
  long in_FS_OFFSET;
  QImage QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QPlatformPixmap).type == BitmapType) {
    format = Format_MonoLSB;
  }
  else {
    format = systemNativeFormat();
  }
  QImage::QImage(&QStack_48,width,height,format);
  this_00 = &this->image;
  QImage::operator=(this_00,&QStack_48);
  QImage::~QImage(&QStack_48);
  (this->super_QPlatformPixmap).w = width;
  (this->super_QPlatformPixmap).h = height;
  iVar2 = QImage::depth(this_00);
  (this->super_QPlatformPixmap).d = iVar2;
  (this->super_QPlatformPixmap).is_null =
       (this->super_QPlatformPixmap).h < 1 || (this->super_QPlatformPixmap).w < 1;
  if ((this->super_QPlatformPixmap).type == BitmapType) {
    bVar1 = QImage::isNull(this_00);
    if (!bVar1) {
      QImage::setColorCount(this_00,2);
      QColor::QColor((QColor *)&QStack_48,color0);
      QVar3 = QColor::rgba((QColor *)&QStack_48);
      QImage::setColor(this_00,0,QVar3);
      QColor::QColor((QColor *)&QStack_48,color1);
      QVar3 = QColor::rgba((QColor *)&QStack_48);
      QImage::setColor(this_00,1,QVar3);
    }
  }
  qVar4 = QImage::cacheKey(this_00);
  QPlatformPixmap::setSerialNumber(&this->super_QPlatformPixmap,(int)((ulong)qVar4 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPlatformPixmap::resize(int width, int height)
{
    QImage::Format format;
    if (pixelType() == BitmapType)
        format = QImage::Format_MonoLSB;
    else
        format = systemNativeFormat();

    image = QImage(width, height, format);
    w = width;
    h = height;
    d = image.depth();
    is_null = (w <= 0 || h <= 0);

    if (pixelType() == BitmapType && !image.isNull()) {
        image.setColorCount(2);
        image.setColor(0, QColor(Qt::color0).rgba());
        image.setColor(1, QColor(Qt::color1).rgba());
    }

    setSerialNumber(image.cacheKey() >> 32);
}